

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_int_t ngx_copy_file(u_char *from,u_char *to,ngx_copy_file_t *cf)

{
  ngx_log_t *pnVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  ngx_int_t nVar7;
  size_t local_f8;
  undefined1 local_e0 [8];
  ngx_file_info_t fi;
  ngx_int_t rc;
  ngx_fd_t nfd;
  ngx_fd_t fd;
  ssize_t n;
  size_t len;
  off_t size;
  char *buf;
  ngx_copy_file_t *cf_local;
  u_char *to_local;
  u_char *from_local;
  
  fi.__glibc_reserved[2] = -1;
  size = 0;
  rc._0_4_ = -1;
  iVar2 = open64((char *)from,0);
  if (iVar2 == -1) {
    if (2 < cf->log->log_level) {
      pnVar1 = cf->log;
      piVar4 = __errno_location();
      ngx_log_error_core(3,pnVar1,*piVar4,"open() \"%s\" failed",from);
    }
  }
  else {
    if (cf->size == -1) {
      iVar3 = fstat64(iVar2,(stat64 *)local_e0);
      if (iVar3 == -1) {
        if (1 < cf->log->log_level) {
          pnVar1 = cf->log;
          piVar4 = __errno_location();
          ngx_log_error_core(2,pnVar1,*piVar4,"fstat() \"%s\" failed",from);
        }
        goto LAB_00124088;
      }
      len = fi.st_rdev;
    }
    else {
      len = cf->size;
    }
    if (cf->buf_size == 0) {
      local_f8 = 0x10000;
    }
    else {
      local_f8 = cf->buf_size;
    }
    n = local_f8;
    if ((long)len < (long)local_f8) {
      n = len;
    }
    size = (off_t)ngx_alloc(n,cf->log);
    if ((void *)size != (void *)0x0) {
      rc._0_4_ = open64((char *)to,0x41,cf->access);
      if ((int)rc == -1) {
        if (2 < cf->log->log_level) {
          pnVar1 = cf->log;
          piVar4 = __errno_location();
          ngx_log_error_core(3,pnVar1,*piVar4,"open() \"%s\" failed",to);
        }
      }
      else {
        for (; 0 < (long)len; len = len - sVar6) {
          if ((long)len < n) {
            n = len;
          }
          sVar5 = read(iVar2,(void *)size,n);
          if (sVar5 == -1) {
            if (1 < cf->log->log_level) {
              pnVar1 = cf->log;
              piVar4 = __errno_location();
              ngx_log_error_core(2,pnVar1,*piVar4,"read() \"%s\" failed",from);
            }
            goto LAB_00124088;
          }
          if (sVar5 != n) {
            if (1 < cf->log->log_level) {
              ngx_log_error_core(2,cf->log,0,"read() has read only %z of %O from %s",sVar5,len,from)
              ;
            }
            goto LAB_00124088;
          }
          sVar6 = ngx_write_fd((int)rc,(void *)size,n);
          if (sVar6 == -1) {
            if (1 < cf->log->log_level) {
              pnVar1 = cf->log;
              piVar4 = __errno_location();
              ngx_log_error_core(2,pnVar1,*piVar4,"write() \"%s\" failed",to);
            }
            goto LAB_00124088;
          }
          if (sVar6 != n) {
            if (1 < cf->log->log_level) {
              ngx_log_error_core(2,cf->log,0,"write() has written only %z of %O to %s",sVar6,len,to)
              ;
            }
            goto LAB_00124088;
          }
        }
        if ((cf->time == -1) || (nVar7 = ngx_set_file_time(to,(int)rc,cf->time), nVar7 == 0)) {
          fi.__glibc_reserved[2] = 0;
        }
        else if (1 < cf->log->log_level) {
          pnVar1 = cf->log;
          piVar4 = __errno_location();
          ngx_log_error_core(2,pnVar1,*piVar4,"utimes() \"%s\" failed",to);
        }
      }
    }
  }
LAB_00124088:
  if ((((int)rc != -1) && (iVar3 = close((int)rc), iVar3 == -1)) && (1 < cf->log->log_level)) {
    pnVar1 = cf->log;
    piVar4 = __errno_location();
    ngx_log_error_core(2,pnVar1,*piVar4,"close() \"%s\" failed",to);
  }
  if (((iVar2 != -1) && (iVar2 = close(iVar2), iVar2 == -1)) && (1 < cf->log->log_level)) {
    pnVar1 = cf->log;
    piVar4 = __errno_location();
    ngx_log_error_core(2,pnVar1,*piVar4,"close() \"%s\" failed",from);
  }
  if (size != 0) {
    free((void *)size);
  }
  return fi.__glibc_reserved[2];
}

Assistant:

ngx_int_t
ngx_copy_file(u_char *from, u_char *to, ngx_copy_file_t *cf)
{
    char             *buf;
    off_t             size;
    size_t            len;
    ssize_t           n;
    ngx_fd_t          fd, nfd;
    ngx_int_t         rc;
    ngx_file_info_t   fi;

    rc = NGX_ERROR;
    buf = NULL;
    nfd = NGX_INVALID_FILE;

    fd = ngx_open_file(from, NGX_FILE_RDONLY, NGX_FILE_OPEN, 0);

    if (fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", from);
        goto failed;
    }

    if (cf->size != -1) {
        size = cf->size;

    } else {
        if (ngx_fd_info(fd, &fi) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_fd_info_n " \"%s\" failed", from);

            goto failed;
        }

        size = ngx_file_size(&fi);
    }

    len = cf->buf_size ? cf->buf_size : 65536;

    if ((off_t) len > size) {
        len = (size_t) size;
    }

    buf = ngx_alloc(len, cf->log);
    if (buf == NULL) {
        goto failed;
    }

    nfd = ngx_open_file(to, NGX_FILE_WRONLY, NGX_FILE_CREATE_OR_OPEN,
                        cf->access);

    if (nfd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", to);
        goto failed;
    }

    while (size > 0) {

        if ((off_t) len > size) {
            len = (size_t) size;
        }

        n = ngx_read_fd(fd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_read_fd_n " \"%s\" failed", from);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_read_fd_n " has read only %z of %O from %s",
                          n, size, from);
            goto failed;
        }

        n = ngx_write_fd(nfd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_write_fd_n " \"%s\" failed", to);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_write_fd_n " has written only %z of %O to %s",
                          n, size, to);
            goto failed;
        }

        size -= n;
    }

    if (cf->time != -1) {
        if (ngx_set_file_time(to, nfd, cf->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", to);
            goto failed;
        }
    }

    rc = NGX_OK;

failed:

    if (nfd != NGX_INVALID_FILE) {
        if (ngx_close_file(nfd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", to);
        }
    }

    if (fd != NGX_INVALID_FILE) {
        if (ngx_close_file(fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", from);
        }
    }

    if (buf) {
        ngx_free(buf);
    }

    return rc;
}